

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O2

SUNErrCode N_VDotProdMulti_ManyVector(int nvec,N_Vector x,N_Vector *Y,sunrealtype *dotprods)

{
  ulong uVar1;
  ulong uVar2;
  sunrealtype sVar3;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)nvec;
  if (nvec < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    sVar3 = (sunrealtype)N_VDotProdLocal(x,Y[uVar2]);
    dotprods[uVar2] = sVar3;
  }
  return 0;
}

Assistant:

SUNErrCode MVAPPEND(N_VDotProdMulti)(int nvec, N_Vector x, N_Vector* Y,
                                     sunrealtype* dotprods)
{
  SUNFunctionBegin(x->sunctx);
  sunindextype i;

  /* call N_VDotProdLocal for each <x,Y[i]> pair */
  for (i = 0; i < nvec; i++)
  {
    dotprods[i] = N_VDotProdLocal(x, Y[i]);
    SUNCheckLastErr();
  }

#ifdef MANYVECTOR_BUILD_WITH_MPI
  /* accumulate totals and return */
  if (MANYVECTOR_COMM(x) != MPI_COMM_NULL)
  {
    SUNCheckMPICall(MPI_Allreduce(MPI_IN_PLACE, dotprods, nvec, MPI_SUNREALTYPE,
                                  MPI_SUM, MANYVECTOR_COMM(x)));
  }
#endif

  /* return with success */
  return SUN_SUCCESS;
}